

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 (*pauVar22) [16];
  byte bVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong in_R11;
  size_t mask;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_131c;
  Scene *local_1318;
  RTCFilterFunctionNArguments local_1310;
  undefined1 (*local_12e0) [16];
  ulong local_12d8;
  ulong local_12d0;
  long local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  ulong local_12a0;
  long local_1298;
  float local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined4 local_1280;
  undefined4 local_127c;
  uint local_1278;
  uint local_1274;
  uint local_1270;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  float local_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar33 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx512vl((undefined1  [16])aVar1,auVar31);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar31,auVar32,1);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = &DAT_3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      local_12e0 = (undefined1 (*) [16])local_f90;
      auVar31 = vdivps_avx(auVar85,(undefined1  [16])aVar1);
      auVar32 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar10 = (bool)((byte)uVar29 & 1);
      auVar33._0_4_ = (uint)bVar10 * auVar32._0_4_ | (uint)!bVar10 * auVar31._0_4_;
      bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar10 * auVar32._4_4_ | (uint)!bVar10 * auVar31._4_4_;
      bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar10 * auVar32._8_4_ | (uint)!bVar10 * auVar31._8_4_;
      bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar10 * auVar32._12_4_ | (uint)!bVar10 * auVar31._12_4_;
      auVar34._8_4_ = 0x3f7ffffa;
      auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar34._12_4_ = 0x3f7ffffa;
      auVar34 = vmulps_avx512vl(auVar33,auVar34);
      auVar35._8_4_ = 0x3f800003;
      auVar35._0_8_ = 0x3f8000033f800003;
      auVar35._12_4_ = 0x3f800003;
      auVar35 = vmulps_avx512vl(auVar33,auVar35);
      uVar83 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_11b0._4_4_ = uVar83;
      local_11b0._0_4_ = uVar83;
      local_11b0._8_4_ = uVar83;
      local_11b0._12_4_ = uVar83;
      auVar92 = ZEXT1664(local_11b0);
      uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_11c0._4_4_ = uVar83;
      local_11c0._0_4_ = uVar83;
      local_11c0._8_4_ = uVar83;
      local_11c0._12_4_ = uVar83;
      auVar94 = ZEXT1664(local_11c0);
      uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_11d0._4_4_ = uVar83;
      local_11d0._0_4_ = uVar83;
      local_11d0._8_4_ = uVar83;
      local_11d0._12_4_ = uVar83;
      auVar95 = ZEXT1664(local_11d0);
      local_11e0 = auVar34._0_4_;
      auVar31 = vmovshdup_avx(auVar34);
      local_11f0 = vshufps_avx(auVar34,auVar34,0x55);
      auVar100 = ZEXT1664(local_11f0);
      auVar32 = vshufpd_avx(auVar34,auVar34,1);
      local_1200 = vshufps_avx(auVar34,auVar34,0xaa);
      auVar101 = ZEXT1664(local_1200);
      local_1210 = auVar35._0_4_;
      local_1220 = vshufps_avx512vl(auVar35,auVar35,0x55);
      auVar106 = ZEXT1664(local_1220);
      local_1230 = vshufps_avx512vl(auVar35,auVar35,0xaa);
      auVar107 = ZEXT1664(local_1230);
      uVar29 = (ulong)(local_11e0 < 0.0) * 0x10;
      local_12a0 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x20;
      local_12a8 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
      local_12b0 = uVar29 ^ 0x10;
      local_12b8 = local_12a0 ^ 0x10;
      local_12c0 = local_12a8 ^ 0x10;
      local_1240 = vbroadcastss_avx512vl(auVar36);
      auVar108 = ZEXT1664(local_1240);
      uVar83 = auVar37._0_4_;
      auVar77 = ZEXT1664(CONCAT412(uVar83,CONCAT48(uVar83,CONCAT44(uVar83,uVar83))));
      fStack_11dc = local_11e0;
      fStack_11d8 = local_11e0;
      fStack_11d4 = local_11e0;
      fStack_120c = local_1210;
      fStack_1208 = local_1210;
      fStack_1204 = local_1210;
      fVar96 = local_11e0;
      fVar97 = local_11e0;
      fVar98 = local_11e0;
      fVar99 = local_11e0;
      fVar102 = local_1210;
      fVar103 = local_1210;
      fVar104 = local_1210;
      fVar105 = local_1210;
      do {
        do {
          do {
            if (local_12e0 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar22 = local_12e0 + -1;
            local_12e0 = local_12e0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar22 + 8));
          uVar28 = *(ulong *)*local_12e0;
          do {
            if ((uVar28 & 8) == 0) {
              auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar29),auVar92._0_16_);
              auVar36._0_4_ = fVar96 * auVar31._0_4_;
              auVar36._4_4_ = fVar97 * auVar31._4_4_;
              auVar36._8_4_ = fVar98 * auVar31._8_4_;
              auVar36._12_4_ = fVar99 * auVar31._12_4_;
              auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + local_12a0),auVar94._0_16_
                                  );
              auVar37._0_4_ = auVar100._0_4_ * auVar31._0_4_;
              auVar37._4_4_ = auVar100._4_4_ * auVar31._4_4_;
              auVar37._8_4_ = auVar100._8_4_ * auVar31._8_4_;
              auVar37._12_4_ = auVar100._12_4_ * auVar31._12_4_;
              auVar31 = vmaxps_avx(auVar36,auVar37);
              auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + local_12a8),auVar95._0_16_
                                  );
              auVar79._0_4_ = auVar101._0_4_ * auVar36._0_4_;
              auVar79._4_4_ = auVar101._4_4_ * auVar36._4_4_;
              auVar79._8_4_ = auVar101._8_4_ * auVar36._8_4_;
              auVar79._12_4_ = auVar101._12_4_ * auVar36._12_4_;
              auVar36 = vmaxps_avx512vl(auVar79,auVar108._0_16_);
              auVar31 = vmaxps_avx(auVar31,auVar36);
              auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + local_12b0),auVar92._0_16_
                                  );
              auVar80._0_4_ = fVar102 * auVar36._0_4_;
              auVar80._4_4_ = fVar103 * auVar36._4_4_;
              auVar80._8_4_ = fVar104 * auVar36._8_4_;
              auVar80._12_4_ = fVar105 * auVar36._12_4_;
              auVar36 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + local_12b8),auVar94._0_16_
                                  );
              auVar36 = vmulps_avx512vl(auVar106._0_16_,auVar36);
              auVar36 = vminps_avx(auVar80,auVar36);
              auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + local_12c0),auVar95._0_16_
                                  );
              auVar37 = vmulps_avx512vl(auVar107._0_16_,auVar37);
              auVar37 = vminps_avx(auVar37,auVar77._0_16_);
              auVar36 = vminps_avx(auVar36,auVar37);
              uVar12 = vcmpps_avx512vl(auVar31,auVar36,2);
              in_R11 = CONCAT44((int)(in_R11 >> 0x20),(uint)(byte)uVar12);
              local_1180._0_16_ = auVar31;
            }
            if ((uVar28 & 8) == 0) {
              if (in_R11 == 0) {
                iVar24 = 4;
              }
              else {
                uVar27 = uVar28 & 0xfffffffffffffff0;
                lVar17 = 0;
                for (uVar28 = in_R11; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  lVar17 = lVar17 + 1;
                }
                iVar24 = 0;
                uVar30 = in_R11 - 1 & in_R11;
                uVar28 = *(ulong *)(uVar27 + lVar17 * 8);
                if (uVar30 != 0) {
                  uVar16 = *(uint *)(local_1180 + lVar17 * 4);
                  lVar17 = 0;
                  for (uVar14 = uVar30; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000
                      ) {
                    lVar17 = lVar17 + 1;
                  }
                  uVar30 = uVar30 - 1 & uVar30;
                  uVar14 = *(ulong *)(uVar27 + lVar17 * 8);
                  uVar25 = *(uint *)(local_1180 + lVar17 * 4);
                  if (uVar30 == 0) {
                    if (uVar16 < uVar25) {
                      *(ulong *)*local_12e0 = uVar14;
                      *(uint *)((long)*local_12e0 + 8) = uVar25;
                      local_12e0 = local_12e0 + 1;
                    }
                    else {
                      *(ulong *)*local_12e0 = uVar28;
                      *(uint *)((long)*local_12e0 + 8) = uVar16;
                      uVar28 = uVar14;
                      local_12e0 = local_12e0 + 1;
                    }
                  }
                  else {
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar28;
                    auVar31 = vpunpcklqdq_avx(auVar78,ZEXT416(uVar16));
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = uVar14;
                    auVar36 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar25));
                    lVar17 = 0;
                    for (uVar28 = uVar30; (uVar28 & 1) == 0;
                        uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                      lVar17 = lVar17 + 1;
                    }
                    uVar30 = uVar30 - 1 & uVar30;
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = *(ulong *)(uVar27 + lVar17 * 8);
                    auVar35 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_1180 + lVar17 * 4)));
                    auVar37 = vpshufd_avx(auVar31,0xaa);
                    auVar32 = vpshufd_avx(auVar36,0xaa);
                    auVar34 = vpshufd_avx(auVar35,0xaa);
                    if (uVar30 == 0) {
                      uVar28 = vpcmpgtd_avx512vl(auVar32,auVar37);
                      uVar28 = uVar28 & 0xf;
                      auVar32 = vpblendmd_avx512vl(auVar36,auVar31);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar38._0_4_ = (uint)bVar10 * auVar32._0_4_ | (uint)!bVar10 * auVar37._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar38._4_4_ = (uint)bVar10 * auVar32._4_4_ | (uint)!bVar10 * auVar37._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar38._8_4_ = (uint)bVar10 * auVar32._8_4_ | (uint)!bVar10 * auVar37._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar38._12_4_ =
                           (uint)bVar10 * auVar32._12_4_ | (uint)!bVar10 * auVar37._12_4_;
                      auVar36 = vmovdqa32_avx512vl(auVar36);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar39._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * auVar31._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar39._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar31._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar39._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar31._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar39._12_4_ =
                           (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar31._12_4_;
                      auVar31 = vpshufd_avx(auVar38,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar34,auVar31);
                      uVar27 = uVar27 & 0xf;
                      auVar36 = vpblendmd_avx512vl(auVar35,auVar38);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      bVar11 = (bool)((byte)(uVar27 >> 1) & 1);
                      uVar28 = CONCAT44((uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar31._4_4_
                                        ,(uint)bVar10 * auVar36._0_4_ |
                                         (uint)!bVar10 * auVar31._0_4_);
                      auVar31 = vmovdqa32_avx512vl(auVar35);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar40._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * auVar38._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar40._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * auVar38._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar40._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * auVar38._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar40._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * auVar38._12_4_;
                      auVar31 = vpshufd_avx(auVar40,0xaa);
                      auVar36 = vpshufd_avx(auVar39,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar31,auVar36);
                      uVar27 = uVar27 & 0xf;
                      auVar36 = vpblendmd_avx512vl(auVar40,auVar39);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar41._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * auVar31._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar41._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar31._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar41._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar31._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar41._12_4_ =
                           (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar31._12_4_;
                      auVar31 = vmovdqa32_avx512vl(auVar40);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar42._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * auVar39._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar42._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * auVar39._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar42._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * auVar39._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar42._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * auVar39._12_4_;
                      *local_12e0 = auVar42;
                      local_12e0[1] = auVar41;
                      local_12e0 = local_12e0 + 2;
                    }
                    else {
                      lVar17 = 0;
                      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                        lVar17 = lVar17 + 1;
                      }
                      uVar16 = *(uint *)(local_1180 + lVar17 * 4);
                      auVar88._8_8_ = 0;
                      auVar88._0_8_ = *(ulong *)(uVar27 + lVar17 * 8);
                      auVar33 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar16));
                      uVar28 = vpcmpgtd_avx512vl(auVar32,auVar37);
                      uVar28 = uVar28 & 0xf;
                      auVar32 = vpblendmd_avx512vl(auVar36,auVar31);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar43._0_4_ = (uint)bVar10 * auVar32._0_4_ | (uint)!bVar10 * auVar37._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar43._4_4_ = (uint)bVar10 * auVar32._4_4_ | (uint)!bVar10 * auVar37._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar43._8_4_ = (uint)bVar10 * auVar32._8_4_ | (uint)!bVar10 * auVar37._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar43._12_4_ =
                           (uint)bVar10 * auVar32._12_4_ | (uint)!bVar10 * auVar37._12_4_;
                      auVar36 = vmovdqa32_avx512vl(auVar36);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar44._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * auVar31._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar44._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar31._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar44._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar31._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar44._12_4_ =
                           (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar31._12_4_;
                      auVar84._4_4_ = uVar16;
                      auVar84._0_4_ = uVar16;
                      auVar84._8_4_ = uVar16;
                      auVar84._12_4_ = uVar16;
                      uVar28 = vpcmpgtd_avx512vl(auVar84,auVar34);
                      uVar28 = uVar28 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar33,auVar35);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar45._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * uVar16;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar45._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * uVar16;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar45._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * uVar16;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar45._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * uVar16;
                      auVar31 = vmovdqa32_avx512vl(auVar33);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar46._0_4_ = (uint)bVar10 * auVar31._0_4_ | (uint)!bVar10 * auVar35._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar46._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * auVar35._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar46._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * auVar35._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar46._12_4_ =
                           (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * auVar35._12_4_;
                      auVar31 = vpshufd_avx(auVar46,0xaa);
                      auVar36 = vpshufd_avx(auVar44,0xaa);
                      uVar28 = vpcmpgtd_avx512vl(auVar31,auVar36);
                      uVar28 = uVar28 & 0xf;
                      auVar36 = vpblendmd_avx512vl(auVar46,auVar44);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar47._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * auVar31._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar47._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar31._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar47._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar31._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar47._12_4_ =
                           (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar31._12_4_;
                      auVar31 = vmovdqa32_avx512vl(auVar46);
                      bVar10 = (bool)((byte)uVar28 & 1);
                      auVar48._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * auVar44._0_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar48._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * auVar44._4_4_;
                      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar48._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * auVar44._8_4_;
                      bVar10 = SUB81(uVar28 >> 3,0);
                      auVar48._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * auVar44._12_4_;
                      auVar31 = vpshufd_avx(auVar45,0xaa);
                      auVar36 = vpshufd_avx(auVar43,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar31,auVar36);
                      uVar27 = uVar27 & 0xf;
                      auVar36 = vpblendmd_avx512vl(auVar45,auVar43);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      bVar11 = (bool)((byte)(uVar27 >> 1) & 1);
                      uVar28 = CONCAT44((uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar31._4_4_
                                        ,(uint)bVar10 * auVar36._0_4_ |
                                         (uint)!bVar10 * auVar31._0_4_);
                      auVar31 = vmovdqa32_avx512vl(auVar45);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar49._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * auVar43._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * auVar43._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * auVar43._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar49._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * auVar43._12_4_;
                      auVar31 = vpshufd_avx(auVar49,0xaa);
                      auVar36 = vpshufd_avx(auVar47,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar36,auVar31);
                      uVar27 = uVar27 & 0xf;
                      auVar36 = vpblendmd_avx512vl(auVar47,auVar49);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar50._0_4_ = (uint)bVar10 * auVar36._0_4_ | (uint)!bVar10 * auVar31._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar50._4_4_ = (uint)bVar10 * auVar36._4_4_ | (uint)!bVar10 * auVar31._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar50._8_4_ = (uint)bVar10 * auVar36._8_4_ | (uint)!bVar10 * auVar31._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar50._12_4_ =
                           (uint)bVar10 * auVar36._12_4_ | (uint)!bVar10 * auVar31._12_4_;
                      auVar31 = vmovdqa32_avx512vl(auVar47);
                      bVar10 = (bool)((byte)uVar27 & 1);
                      auVar51._0_4_ = (uint)bVar10 * auVar31._0_4_ | !bVar10 * auVar49._0_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar51._4_4_ = (uint)bVar10 * auVar31._4_4_ | !bVar10 * auVar49._4_4_;
                      bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar51._8_4_ = (uint)bVar10 * auVar31._8_4_ | !bVar10 * auVar49._8_4_;
                      bVar10 = SUB81(uVar27 >> 3,0);
                      auVar51._12_4_ = (uint)bVar10 * auVar31._12_4_ | !bVar10 * auVar49._12_4_;
                      *local_12e0 = auVar48;
                      local_12e0[1] = auVar51;
                      local_12e0[2] = auVar50;
                      local_12e0 = local_12e0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar24 = 6;
            }
          } while (iVar24 == 0);
        } while (iVar24 != 6);
        local_12c8 = (ulong)((uint)uVar28 & 0xf) - 8;
        if (local_12c8 != 0) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          local_1318 = context->scene;
          local_1298 = 0;
          local_12d0 = in_R11;
          local_12d8 = uVar28;
          do {
            lVar26 = local_1298 * 0x60;
            ppfVar2 = (local_1318->vertices).items;
            pfVar3 = ppfVar2[*(uint *)(uVar28 + 0x48 + lVar26)];
            auVar54._16_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar28 + 0x28 + lVar26));
            auVar54._0_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar28 + 8 + lVar26));
            pfVar4 = ppfVar2[*(uint *)(uVar28 + 0x40 + lVar26)];
            auVar55._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + 0x20 + lVar26));
            auVar55._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar28 + lVar26));
            pfVar5 = ppfVar2[*(uint *)(uVar28 + 0x4c + lVar26)];
            auVar61._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x2c + lVar26));
            auVar61._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0xc + lVar26));
            pfVar6 = ppfVar2[*(uint *)(uVar28 + 0x44 + lVar26)];
            auVar62._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x24 + lVar26));
            auVar62._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 4 + lVar26));
            lVar17 = uVar28 + 0x40 + lVar26;
            local_fc0 = *(undefined8 *)(lVar17 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar17 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar17 = uVar28 + 0x50 + lVar26;
            local_11a0 = *(undefined8 *)(lVar17 + 0x10);
            uStack_1198 = *(undefined8 *)(lVar17 + 0x18);
            auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar28 + 0x10 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar28 + 0x18 + lVar26)));
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar28 + 0x10 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar28 + 0x18 + lVar26)));
            auVar32 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar28 + 0x14 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar28 + 0x1c + lVar26)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar28 + 0x14 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar28 + 0x1c + lVar26)));
            auVar34 = vunpcklps_avx(auVar31,auVar36);
            auVar35 = vunpcklps_avx(auVar37,auVar32);
            auVar31 = vunpckhps_avx(auVar37,auVar32);
            auVar32 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar28 + 0x30 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar28 + 0x38 + lVar26)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar28 + 0x30 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar28 + 0x38 + lVar26)));
            auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar28 + 0x34 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar28 + 0x3c + lVar26)));
            auVar37 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar28 + 0x34 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar28 + 0x3c + lVar26)));
            auVar37 = vunpcklps_avx(auVar36,auVar37);
            auVar85 = vunpcklps_avx(auVar32,auVar33);
            auVar36 = vunpckhps_avx(auVar32,auVar33);
            uStack_1190 = local_11a0;
            uStack_1188 = uStack_1198;
            auVar74 = vunpcklps_avx(auVar62,auVar61);
            auVar73 = vunpcklps_avx(auVar55,auVar54);
            auVar57 = vunpcklps_avx(auVar73,auVar74);
            auVar73 = vunpckhps_avx(auVar73,auVar74);
            auVar74 = vunpckhps_avx(auVar62,auVar61);
            auVar56 = vunpckhps_avx(auVar55,auVar54);
            auVar56 = vunpcklps_avx(auVar56,auVar74);
            auVar59._16_16_ = auVar35;
            auVar59._0_16_ = auVar35;
            auVar63._16_16_ = auVar31;
            auVar63._0_16_ = auVar31;
            auVar58._16_16_ = auVar34;
            auVar58._0_16_ = auVar34;
            auVar64._16_16_ = auVar85;
            auVar64._0_16_ = auVar85;
            auVar65._16_16_ = auVar36;
            auVar65._0_16_ = auVar36;
            uVar83 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar66._4_4_ = uVar83;
            auVar66._0_4_ = uVar83;
            auVar66._8_4_ = uVar83;
            auVar66._12_4_ = uVar83;
            auVar66._16_4_ = uVar83;
            auVar66._20_4_ = uVar83;
            auVar66._24_4_ = uVar83;
            auVar66._28_4_ = uVar83;
            auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar83 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar86._4_4_ = uVar83;
            auVar86._0_4_ = uVar83;
            auVar86._8_4_ = uVar83;
            auVar86._12_4_ = uVar83;
            auVar86._16_4_ = uVar83;
            auVar86._20_4_ = uVar83;
            auVar86._24_4_ = uVar83;
            auVar86._28_4_ = uVar83;
            auVar60._16_16_ = auVar37;
            auVar60._0_16_ = auVar37;
            uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar89._4_4_ = uVar83;
            auVar89._0_4_ = uVar83;
            auVar89._8_4_ = uVar83;
            auVar89._12_4_ = uVar83;
            auVar89._16_4_ = uVar83;
            auVar89._20_4_ = uVar83;
            auVar89._24_4_ = uVar83;
            auVar89._28_4_ = uVar83;
            fVar96 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar91._4_4_ = fVar96;
            auVar91._0_4_ = fVar96;
            auVar91._8_4_ = fVar96;
            auVar91._12_4_ = fVar96;
            auVar91._16_4_ = fVar96;
            auVar91._20_4_ = fVar96;
            auVar91._24_4_ = fVar96;
            auVar91._28_4_ = fVar96;
            auVar74 = vsubps_avx(auVar57,auVar66);
            auVar54 = vsubps_avx512vl(auVar73,auVar52);
            auVar55 = vsubps_avx512vl(auVar56,auVar53);
            auVar56 = vsubps_avx512vl(auVar59,auVar66);
            auVar57 = vsubps_avx512vl(auVar63,auVar52);
            auVar58 = vsubps_avx512vl(auVar58,auVar53);
            auVar59 = vsubps_avx512vl(auVar64,auVar66);
            auVar52 = vsubps_avx512vl(auVar65,auVar52);
            auVar60 = vsubps_avx512vl(auVar60,auVar53);
            auVar61 = vsubps_avx512vl(auVar59,auVar74);
            auVar73 = vsubps_avx(auVar52,auVar54);
            auVar62 = vsubps_avx512vl(auVar60,auVar55);
            auVar63 = vsubps_avx512vl(auVar74,auVar56);
            auVar64 = vsubps_avx512vl(auVar54,auVar57);
            auVar65 = vsubps_avx512vl(auVar55,auVar58);
            auVar66 = vsubps_avx512vl(auVar56,auVar59);
            auVar67 = vsubps_avx512vl(auVar57,auVar52);
            auVar68 = vsubps_avx512vl(auVar58,auVar60);
            auVar69 = vaddps_avx512vl(auVar59,auVar74);
            auVar93._0_4_ = auVar52._0_4_ + auVar54._0_4_;
            auVar93._4_4_ = auVar52._4_4_ + auVar54._4_4_;
            auVar93._8_4_ = auVar52._8_4_ + auVar54._8_4_;
            auVar93._12_4_ = auVar52._12_4_ + auVar54._12_4_;
            auVar93._16_4_ = auVar52._16_4_ + auVar54._16_4_;
            auVar93._20_4_ = auVar52._20_4_ + auVar54._20_4_;
            auVar93._24_4_ = auVar52._24_4_ + auVar54._24_4_;
            auVar93._28_4_ = auVar52._28_4_ + auVar54._28_4_;
            auVar53 = vaddps_avx512vl(auVar60,auVar55);
            auVar70 = vmulps_avx512vl(auVar93,auVar62);
            auVar70 = vfmsub231ps_avx512vl(auVar70,auVar73,auVar53);
            auVar53 = vmulps_avx512vl(auVar53,auVar61);
            auVar71 = vfmsub231ps_avx512vl(auVar53,auVar62,auVar69);
            auVar53._4_4_ = auVar73._4_4_ * auVar69._4_4_;
            auVar53._0_4_ = auVar73._0_4_ * auVar69._0_4_;
            auVar53._8_4_ = auVar73._8_4_ * auVar69._8_4_;
            auVar53._12_4_ = auVar73._12_4_ * auVar69._12_4_;
            auVar53._16_4_ = auVar73._16_4_ * auVar69._16_4_;
            auVar53._20_4_ = auVar73._20_4_ * auVar69._20_4_;
            auVar53._24_4_ = auVar73._24_4_ * auVar69._24_4_;
            auVar53._28_4_ = auVar69._28_4_;
            auVar31 = vfmsub231ps_fma(auVar53,auVar61,auVar93);
            auVar72._0_4_ = fVar96 * auVar31._0_4_;
            auVar72._4_4_ = fVar96 * auVar31._4_4_;
            auVar72._8_4_ = fVar96 * auVar31._8_4_;
            auVar72._12_4_ = fVar96 * auVar31._12_4_;
            auVar72._16_4_ = fVar96 * 0.0;
            auVar72._20_4_ = fVar96 * 0.0;
            auVar72._24_4_ = fVar96 * 0.0;
            auVar72._28_4_ = 0;
            auVar53 = vfmadd231ps_avx512vl(auVar72,auVar89,auVar71);
            auVar53 = vfmadd231ps_avx512vl(auVar53,auVar86,auVar70);
            auVar69 = vaddps_avx512vl(auVar74,auVar56);
            auVar70 = vaddps_avx512vl(auVar54,auVar57);
            auVar71 = vaddps_avx512vl(auVar55,auVar58);
            auVar72 = vmulps_avx512vl(auVar70,auVar65);
            auVar72 = vfmsub231ps_avx512vl(auVar72,auVar64,auVar71);
            auVar71 = vmulps_avx512vl(auVar71,auVar63);
            auVar71 = vfmsub231ps_avx512vl(auVar71,auVar65,auVar69);
            auVar69 = vmulps_avx512vl(auVar69,auVar64);
            auVar70 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar70);
            auVar69._4_4_ = fVar96 * auVar70._4_4_;
            auVar69._0_4_ = fVar96 * auVar70._0_4_;
            auVar69._8_4_ = fVar96 * auVar70._8_4_;
            auVar69._12_4_ = fVar96 * auVar70._12_4_;
            auVar69._16_4_ = fVar96 * auVar70._16_4_;
            auVar69._20_4_ = fVar96 * auVar70._20_4_;
            auVar69._24_4_ = fVar96 * auVar70._24_4_;
            auVar69._28_4_ = auVar70._28_4_;
            auVar69 = vfmadd231ps_avx512vl(auVar69,auVar89,auVar71);
            local_1160 = vfmadd231ps_avx512vl(auVar69,auVar86,auVar72);
            auVar56 = vaddps_avx512vl(auVar56,auVar59);
            auVar57 = vaddps_avx512vl(auVar57,auVar52);
            auVar52 = vaddps_avx512vl(auVar58,auVar60);
            auVar69 = vmulps_avx512vl(auVar57,auVar68);
            auVar69 = vfmsub231ps_avx512vl(auVar69,auVar67,auVar52);
            auVar52 = vmulps_avx512vl(auVar52,auVar66);
            auVar52 = vfmsub231ps_avx512vl(auVar52,auVar68,auVar56);
            auVar56 = vmulps_avx512vl(auVar56,auVar67);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar66,auVar57);
            auVar56 = vmulps_avx512vl(auVar91,auVar56);
            auVar56 = vfmadd231ps_avx512vl(auVar56,auVar89,auVar52);
            auVar69 = vfmadd231ps_avx512vl(auVar56,auVar86,auVar69);
            auVar70._0_4_ = local_1160._0_4_ + auVar53._0_4_;
            auVar70._4_4_ = local_1160._4_4_ + auVar53._4_4_;
            auVar70._8_4_ = local_1160._8_4_ + auVar53._8_4_;
            auVar70._12_4_ = local_1160._12_4_ + auVar53._12_4_;
            auVar70._16_4_ = local_1160._16_4_ + auVar53._16_4_;
            auVar70._20_4_ = local_1160._20_4_ + auVar53._20_4_;
            auVar70._24_4_ = local_1160._24_4_ + auVar53._24_4_;
            auVar70._28_4_ = local_1160._28_4_ + auVar53._28_4_;
            local_1140 = vaddps_avx512vl(auVar69,auVar70);
            auVar56._8_4_ = 0x7fffffff;
            auVar56._0_8_ = 0x7fffffff7fffffff;
            auVar56._12_4_ = 0x7fffffff;
            auVar56._16_4_ = 0x7fffffff;
            auVar56._20_4_ = 0x7fffffff;
            auVar56._24_4_ = 0x7fffffff;
            auVar56._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_1140,auVar56);
            auVar57._8_4_ = 0x34000000;
            auVar57._0_8_ = 0x3400000034000000;
            auVar57._12_4_ = 0x34000000;
            auVar57._16_4_ = 0x34000000;
            auVar57._20_4_ = 0x34000000;
            auVar57._24_4_ = 0x34000000;
            auVar57._28_4_ = 0x34000000;
            auVar56 = vmulps_avx512vl(local_1140,auVar57);
            auVar57 = vminps_avx512vl(auVar53,local_1160);
            auVar57 = vminps_avx512vl(auVar57,auVar69);
            auVar52._8_4_ = 0x80000000;
            auVar52._0_8_ = 0x8000000080000000;
            auVar52._12_4_ = 0x80000000;
            auVar52._16_4_ = 0x80000000;
            auVar52._20_4_ = 0x80000000;
            auVar52._24_4_ = 0x80000000;
            auVar52._28_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar56,auVar52);
            uVar12 = vcmpps_avx512vl(auVar57,auVar52,5);
            auVar57 = vmaxps_avx512vl(auVar53,local_1160);
            auVar57 = vmaxps_avx512vl(auVar57,auVar69);
            uVar13 = vcmpps_avx512vl(auVar57,auVar56,2);
            local_10c0 = (byte)uVar12 | (byte)uVar13;
            if (local_10c0 != 0) {
              auVar56 = vmulps_avx512vl(auVar62,auVar64);
              auVar57 = vmulps_avx512vl(auVar61,auVar65);
              auVar52 = vmulps_avx512vl(auVar73,auVar63);
              auVar69 = vmulps_avx512vl(auVar65,auVar67);
              auVar58 = vmulps_avx512vl(auVar63,auVar68);
              auVar59 = vmulps_avx512vl(auVar64,auVar66);
              auVar73 = vfmsub213ps_avx512vl(auVar73,auVar65,auVar56);
              auVar60 = vfmsub213ps_avx512vl(auVar62,auVar63,auVar57);
              auVar61 = vfmsub213ps_avx512vl(auVar61,auVar64,auVar52);
              auVar62 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar69);
              auVar64 = vfmsub213ps_avx512vl(auVar66,auVar65,auVar58);
              auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar59);
              auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar56,auVar65);
              vandps_avx512vl(auVar69,auVar65);
              uVar27 = vcmpps_avx512vl(auVar65,auVar65,1);
              vandps_avx512vl(auVar57,auVar65);
              vandps_avx512vl(auVar58,auVar65);
              uVar30 = vcmpps_avx512vl(auVar65,auVar65,1);
              vandps_avx512vl(auVar52,auVar65);
              vandps_avx512vl(auVar59,auVar65);
              uVar14 = vcmpps_avx512vl(auVar65,auVar65,1);
              bVar10 = (bool)((byte)uVar27 & 1);
              local_1120._0_4_ =
                   (float)((uint)bVar10 * auVar73._0_4_ | (uint)!bVar10 * auVar62._0_4_);
              bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
              local_1120._4_4_ =
                   (float)((uint)bVar10 * auVar73._4_4_ | (uint)!bVar10 * auVar62._4_4_);
              bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
              local_1120._8_4_ =
                   (float)((uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * auVar62._8_4_);
              bVar10 = (bool)((byte)(uVar27 >> 3) & 1);
              local_1120._12_4_ =
                   (float)((uint)bVar10 * auVar73._12_4_ | (uint)!bVar10 * auVar62._12_4_);
              bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
              local_1120._16_4_ =
                   (float)((uint)bVar10 * auVar73._16_4_ | (uint)!bVar10 * auVar62._16_4_);
              bVar10 = (bool)((byte)(uVar27 >> 5) & 1);
              local_1120._20_4_ =
                   (float)((uint)bVar10 * auVar73._20_4_ | (uint)!bVar10 * auVar62._20_4_);
              bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
              local_1120._24_4_ =
                   (float)((uint)bVar10 * auVar73._24_4_ | (uint)!bVar10 * auVar62._24_4_);
              bVar10 = SUB81(uVar27 >> 7,0);
              local_1120._28_4_ = (uint)bVar10 * auVar73._28_4_ | (uint)!bVar10 * auVar62._28_4_;
              bVar10 = (bool)((byte)uVar30 & 1);
              local_1100._0_4_ =
                   (float)((uint)bVar10 * auVar60._0_4_ | (uint)!bVar10 * auVar64._0_4_);
              bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
              local_1100._4_4_ =
                   (float)((uint)bVar10 * auVar60._4_4_ | (uint)!bVar10 * auVar64._4_4_);
              bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
              local_1100._8_4_ =
                   (float)((uint)bVar10 * auVar60._8_4_ | (uint)!bVar10 * auVar64._8_4_);
              bVar10 = (bool)((byte)(uVar30 >> 3) & 1);
              local_1100._12_4_ =
                   (float)((uint)bVar10 * auVar60._12_4_ | (uint)!bVar10 * auVar64._12_4_);
              bVar10 = (bool)((byte)(uVar30 >> 4) & 1);
              local_1100._16_4_ =
                   (float)((uint)bVar10 * auVar60._16_4_ | (uint)!bVar10 * auVar64._16_4_);
              bVar10 = (bool)((byte)(uVar30 >> 5) & 1);
              local_1100._20_4_ =
                   (float)((uint)bVar10 * auVar60._20_4_ | (uint)!bVar10 * auVar64._20_4_);
              bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
              local_1100._24_4_ =
                   (float)((uint)bVar10 * auVar60._24_4_ | (uint)!bVar10 * auVar64._24_4_);
              bVar10 = SUB81(uVar30 >> 7,0);
              local_1100._28_4_ = (uint)bVar10 * auVar60._28_4_ | (uint)!bVar10 * auVar64._28_4_;
              bVar10 = (bool)((byte)uVar14 & 1);
              local_10e0 = (float)((uint)bVar10 * auVar61._0_4_ | (uint)!bVar10 * auVar63._0_4_);
              bVar10 = (bool)((byte)(uVar14 >> 1) & 1);
              fStack_10dc = (float)((uint)bVar10 * auVar61._4_4_ | (uint)!bVar10 * auVar63._4_4_);
              bVar10 = (bool)((byte)(uVar14 >> 2) & 1);
              fStack_10d8 = (float)((uint)bVar10 * auVar61._8_4_ | (uint)!bVar10 * auVar63._8_4_);
              bVar10 = (bool)((byte)(uVar14 >> 3) & 1);
              fStack_10d4 = (float)((uint)bVar10 * auVar61._12_4_ | (uint)!bVar10 * auVar63._12_4_);
              bVar10 = (bool)((byte)(uVar14 >> 4) & 1);
              fStack_10d0 = (float)((uint)bVar10 * auVar61._16_4_ | (uint)!bVar10 * auVar63._16_4_);
              bVar10 = (bool)((byte)(uVar14 >> 5) & 1);
              fStack_10cc = (float)((uint)bVar10 * auVar61._20_4_ | (uint)!bVar10 * auVar63._20_4_);
              bVar10 = (bool)((byte)(uVar14 >> 6) & 1);
              fStack_10c8 = (float)((uint)bVar10 * auVar61._24_4_ | (uint)!bVar10 * auVar63._24_4_);
              bVar10 = SUB81(uVar14 >> 7,0);
              uStack_10c4 = (uint)bVar10 * auVar61._28_4_ | (uint)!bVar10 * auVar63._28_4_;
              auVar71._4_4_ = fVar96 * fStack_10dc;
              auVar71._0_4_ = fVar96 * local_10e0;
              auVar71._8_4_ = fVar96 * fStack_10d8;
              auVar71._12_4_ = fVar96 * fStack_10d4;
              auVar71._16_4_ = fVar96 * fStack_10d0;
              auVar71._20_4_ = fVar96 * fStack_10cc;
              auVar71._24_4_ = fVar96 * fStack_10c8;
              auVar71._28_4_ = fVar96;
              auVar31 = vfmadd213ps_fma(auVar89,local_1100,auVar71);
              auVar31 = vfmadd213ps_fma(auVar86,local_1120,ZEXT1632(auVar31));
              auVar56 = ZEXT1632(CONCAT412(auVar31._12_4_ + auVar31._12_4_,
                                           CONCAT48(auVar31._8_4_ + auVar31._8_4_,
                                                    CONCAT44(auVar31._4_4_ + auVar31._4_4_,
                                                             auVar31._0_4_ + auVar31._0_4_))));
              auVar90._0_4_ = auVar55._0_4_ * local_10e0;
              auVar90._4_4_ = auVar55._4_4_ * fStack_10dc;
              auVar90._8_4_ = auVar55._8_4_ * fStack_10d8;
              auVar90._12_4_ = auVar55._12_4_ * fStack_10d4;
              auVar90._16_4_ = auVar55._16_4_ * fStack_10d0;
              auVar90._20_4_ = auVar55._20_4_ * fStack_10cc;
              auVar90._24_4_ = auVar55._24_4_ * fStack_10c8;
              auVar90._28_4_ = 0;
              auVar31 = vfmadd213ps_fma(auVar54,local_1100,auVar90);
              auVar36 = vfmadd213ps_fma(auVar74,local_1120,ZEXT1632(auVar31));
              auVar73 = vrcp14ps_avx512vl(auVar56);
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = &DAT_3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar74._16_4_ = 0x3f800000;
              auVar74._20_4_ = 0x3f800000;
              auVar74._24_4_ = 0x3f800000;
              auVar74._28_4_ = 0x3f800000;
              auVar74 = vfnmadd213ps_avx512vl(auVar73,auVar56,auVar74);
              auVar31 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
              local_1060 = ZEXT1632(CONCAT412((auVar36._12_4_ + auVar36._12_4_) * auVar31._12_4_,
                                              CONCAT48((auVar36._8_4_ + auVar36._8_4_) *
                                                       auVar31._8_4_,
                                                       CONCAT44((auVar36._4_4_ + auVar36._4_4_) *
                                                                auVar31._4_4_,
                                                                (auVar36._0_4_ + auVar36._0_4_) *
                                                                auVar31._0_4_))));
              uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar73._4_4_ = uVar83;
              auVar73._0_4_ = uVar83;
              auVar73._8_4_ = uVar83;
              auVar73._12_4_ = uVar83;
              auVar73._16_4_ = uVar83;
              auVar73._20_4_ = uVar83;
              auVar73._24_4_ = uVar83;
              auVar73._28_4_ = uVar83;
              uVar12 = vcmpps_avx512vl(local_1060,auVar73,0xd);
              auVar67._8_4_ = 0x80000000;
              auVar67._0_8_ = 0x8000000080000000;
              auVar67._12_4_ = 0x80000000;
              auVar67._16_4_ = 0x80000000;
              auVar67._20_4_ = 0x80000000;
              auVar67._24_4_ = 0x80000000;
              auVar67._28_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(auVar56,auVar67);
              fVar96 = (ray->super_RayK<1>).tfar;
              auVar68._4_4_ = fVar96;
              auVar68._0_4_ = fVar96;
              auVar68._8_4_ = fVar96;
              auVar68._12_4_ = fVar96;
              auVar68._16_4_ = fVar96;
              auVar68._20_4_ = fVar96;
              auVar68._24_4_ = fVar96;
              auVar68._28_4_ = fVar96;
              uVar13 = vcmpps_avx512vl(local_1060,auVar68,2);
              uVar15 = vcmpps_avx512vl(auVar56,auVar74,4);
              local_10c0 = (byte)uVar12 & (byte)uVar13 & (byte)uVar15 & local_10c0;
              uVar27 = (ulong)local_10c0;
              if (local_10c0 != 0) {
                local_1180 = auVar53;
                local_fe0 = 0xf0;
                auVar18._8_4_ = 0x219392ef;
                auVar18._0_8_ = 0x219392ef219392ef;
                auVar18._12_4_ = 0x219392ef;
                auVar18._16_4_ = 0x219392ef;
                auVar18._20_4_ = 0x219392ef;
                auVar18._24_4_ = 0x219392ef;
                auVar18._28_4_ = 0x219392ef;
                uVar28 = vcmpps_avx512vl(local_1140,auVar18,5);
                auVar73 = vrcp14ps_avx512vl(local_1140);
                auVar87._8_4_ = 0x3f800000;
                auVar87._0_8_ = &DAT_3f8000003f800000;
                auVar87._12_4_ = 0x3f800000;
                auVar87._16_4_ = 0x3f800000;
                auVar87._20_4_ = 0x3f800000;
                auVar87._24_4_ = 0x3f800000;
                auVar87._28_4_ = 0x3f800000;
                auVar31 = vfnmadd213ps_fma(local_1140,auVar73,auVar87);
                auVar74 = vfmadd132ps_avx512vl(ZEXT1632(auVar31),auVar73,auVar73);
                fVar97 = (float)((uint)((byte)uVar28 & 1) * auVar74._0_4_);
                fVar96 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar74._4_4_);
                fVar98 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar74._8_4_);
                fVar99 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar74._12_4_);
                fVar104 = (float)((uint)((byte)(uVar28 >> 4) & 1) * auVar74._16_4_);
                fVar103 = (float)((uint)((byte)(uVar28 >> 5) & 1) * auVar74._20_4_);
                fVar102 = (float)((uint)((byte)(uVar28 >> 6) & 1) * auVar74._24_4_);
                auVar20._4_4_ = fVar96 * auVar53._4_4_;
                auVar20._0_4_ = fVar97 * auVar53._0_4_;
                auVar20._8_4_ = fVar98 * auVar53._8_4_;
                auVar20._12_4_ = fVar99 * auVar53._12_4_;
                auVar20._16_4_ = fVar104 * auVar53._16_4_;
                auVar20._20_4_ = fVar103 * auVar53._20_4_;
                auVar20._24_4_ = fVar102 * auVar53._24_4_;
                auVar20._28_4_ = auVar53._28_4_;
                auVar74 = vminps_avx(auVar20,auVar87);
                auVar21._4_4_ = local_1160._4_4_ * fVar96;
                auVar21._0_4_ = local_1160._0_4_ * fVar97;
                auVar21._8_4_ = local_1160._8_4_ * fVar98;
                auVar21._12_4_ = local_1160._12_4_ * fVar99;
                auVar21._16_4_ = local_1160._16_4_ * fVar104;
                auVar21._20_4_ = local_1160._20_4_ * fVar103;
                auVar21._24_4_ = local_1160._24_4_ * fVar102;
                auVar21._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx(auVar21,auVar87);
                auVar56 = vsubps_avx(auVar87,auVar74);
                auVar57 = vsubps_avx(auVar87,auVar73);
                local_1080 = vblendps_avx(auVar73,auVar56,0xf0);
                local_10a0 = vblendps_avx(auVar74,auVar57,0xf0);
                fVar96 = (float)DAT_02060940;
                fVar97 = DAT_02060940._4_4_;
                fVar98 = DAT_02060940._8_4_;
                fVar99 = DAT_02060940._12_4_;
                fVar102 = DAT_02060940._16_4_;
                fVar103 = DAT_02060940._20_4_;
                fVar104 = DAT_02060940._24_4_;
                local_1040[0] = local_1120._0_4_ * fVar96;
                local_1040[1] = local_1120._4_4_ * fVar97;
                local_1040[2] = local_1120._8_4_ * fVar98;
                local_1040[3] = local_1120._12_4_ * fVar99;
                fStack_1030 = local_1120._16_4_ * fVar102;
                fStack_102c = local_1120._20_4_ * fVar103;
                fStack_1028 = local_1120._24_4_ * fVar104;
                uStack_1024 = local_1120._28_4_;
                local_1020[0] = local_1100._0_4_ * fVar96;
                local_1020[1] = local_1100._4_4_ * fVar97;
                local_1020[2] = local_1100._8_4_ * fVar98;
                local_1020[3] = local_1100._12_4_ * fVar99;
                fStack_1010 = local_1100._16_4_ * fVar102;
                fStack_100c = local_1100._20_4_ * fVar103;
                fStack_1008 = local_1100._24_4_ * fVar104;
                uStack_1004 = local_1100._28_4_;
                local_1000[0] = local_10e0 * fVar96;
                local_1000[1] = fStack_10dc * fVar97;
                local_1000[2] = fStack_10d8 * fVar98;
                local_1000[3] = fStack_10d4 * fVar99;
                fStack_ff0 = fStack_10d0 * fVar102;
                fStack_fec = fStack_10cc * fVar103;
                fStack_fe8 = fStack_10c8 * fVar104;
                uStack_fe4 = uStack_10c4;
                auVar76._8_4_ = 0x7f800000;
                auVar76._0_8_ = 0x7f8000007f800000;
                auVar76._12_4_ = 0x7f800000;
                auVar76._16_4_ = 0x7f800000;
                auVar76._20_4_ = 0x7f800000;
                auVar76._24_4_ = 0x7f800000;
                auVar76._28_4_ = 0x7f800000;
                auVar74 = vblendmps_avx512vl(auVar76,local_1060);
                auVar75._0_4_ =
                     (uint)(local_10c0 & 1) * auVar74._0_4_ |
                     (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 1 & 1);
                auVar75._4_4_ = (uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 2 & 1);
                auVar75._8_4_ = (uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 3 & 1);
                auVar75._12_4_ = (uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 4 & 1);
                auVar75._16_4_ = (uint)bVar10 * auVar74._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 5 & 1);
                auVar75._20_4_ = (uint)bVar10 * auVar74._20_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_10c0 >> 6 & 1);
                auVar75._24_4_ = (uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * 0x7f800000;
                auVar75._28_4_ =
                     (uint)(local_10c0 >> 7) * auVar74._28_4_ |
                     (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
                auVar74 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar74 = vminps_avx(auVar75,auVar74);
                auVar73 = vshufpd_avx(auVar74,auVar74,5);
                auVar74 = vminps_avx(auVar74,auVar73);
                auVar73 = vpermpd_avx2(auVar74,0x4e);
                auVar74 = vminps_avx(auVar74,auVar73);
                uVar12 = vcmpps_avx512vl(auVar75,auVar74,0);
                bVar23 = local_10c0;
                if (((byte)uVar12 & local_10c0) != 0) {
                  bVar23 = (byte)uVar12 & local_10c0;
                }
                local_1260 = local_1060;
                do {
                  uVar16 = 0;
                  for (uVar25 = (uint)bVar23; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000)
                  {
                    uVar16 = uVar16 + 1;
                  }
                  uVar25 = *(uint *)((long)&local_fc0 + (ulong)uVar16 * 4);
                  pGVar7 = (local_1318->geometries).items[uVar25].ptr;
                  if ((pGVar7->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar27 = (ulong)(byte)(~(byte)(1 << (uVar16 & 0x1f)) & (byte)uVar27);
LAB_01f4f4f4:
                    bVar10 = true;
                  }
                  else {
                    pRVar8 = context->args;
                    if ((pRVar8->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar28 = (ulong)(uVar16 * 4);
                      local_1310.context = context->user;
                      local_1290 = *(float *)((long)local_1040 + uVar28);
                      local_128c = *(undefined4 *)((long)local_1020 + uVar28);
                      local_1288 = *(undefined4 *)((long)local_1000 + uVar28);
                      local_1284 = *(undefined4 *)(local_10a0 + uVar28);
                      local_1280 = *(undefined4 *)(local_1080 + uVar28);
                      local_127c = *(undefined4 *)((long)&local_11a0 + uVar28);
                      local_1278 = uVar25;
                      local_1274 = (local_1310.context)->instID[0];
                      local_1270 = (local_1310.context)->instPrimID[0];
                      fVar96 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar28);
                      local_131c = -1;
                      local_1310.valid = &local_131c;
                      local_1310.geometryUserPtr = pGVar7->userPtr;
                      local_1310.ray = (RTCRayN *)ray;
                      local_1310.hit = (RTCHitN *)&local_1290;
                      local_1310.N = 1;
                      if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar7->intersectionFilterN)(&local_1310), *local_1310.valid != 0)) {
                        if (pRVar8->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar8->filter)(&local_1310);
                          }
                          if (*local_1310.valid == 0) goto LAB_01f4f6d5;
                        }
                        (((Vec3f *)((long)local_1310.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1310.hit;
                        (((Vec3f *)((long)local_1310.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1310.hit + 4);
                        (((Vec3f *)((long)local_1310.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1310.hit + 8);
                        *(float *)((long)local_1310.ray + 0x3c) = *(float *)(local_1310.hit + 0xc);
                        *(float *)((long)local_1310.ray + 0x40) = *(float *)(local_1310.hit + 0x10);
                        *(float *)((long)local_1310.ray + 0x44) = *(float *)(local_1310.hit + 0x14);
                        *(float *)((long)local_1310.ray + 0x48) = *(float *)(local_1310.hit + 0x18);
                        *(float *)((long)local_1310.ray + 0x4c) = *(float *)(local_1310.hit + 0x1c);
                        *(float *)((long)local_1310.ray + 0x50) = *(float *)(local_1310.hit + 0x20);
                      }
                      else {
LAB_01f4f6d5:
                        (ray->super_RayK<1>).tfar = fVar96;
                      }
                      fVar96 = (ray->super_RayK<1>).tfar;
                      auVar19._4_4_ = fVar96;
                      auVar19._0_4_ = fVar96;
                      auVar19._8_4_ = fVar96;
                      auVar19._12_4_ = fVar96;
                      auVar19._16_4_ = fVar96;
                      auVar19._20_4_ = fVar96;
                      auVar19._24_4_ = fVar96;
                      auVar19._28_4_ = fVar96;
                      uVar28 = vcmpps_avx512vl(local_1260,auVar19,2);
                      uVar27 = (byte)(~(byte)(1 << (uVar16 & 0x1f)) & (byte)uVar27) & uVar28;
                      goto LAB_01f4f4f4;
                    }
                    bVar10 = false;
                  }
                  uVar28 = local_12d8;
                  in_R11 = local_12d0;
                  if (!bVar10) {
                    uVar27 = (ulong)(uVar16 << 2);
                    fVar96 = *(float *)(local_10a0 + uVar27);
                    fVar97 = *(float *)(local_1080 + uVar27);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar27);
                    (ray->Ng).field_0.field_0.x = *(float *)((long)local_1040 + uVar27);
                    (ray->Ng).field_0.field_0.y = *(float *)((long)local_1020 + uVar27);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)local_1000 + uVar27);
                    ray->u = fVar96;
                    ray->v = fVar97;
                    ray->primID = *(uint *)((long)&local_11a0 + uVar27);
                    ray->geomID = uVar25;
                    pRVar9 = context->user;
                    ray->instID[0] = pRVar9->instID[0];
                    ray->instPrimID[0] = pRVar9->instPrimID[0];
                    break;
                  }
                  if ((char)uVar27 == '\0') break;
                  BVHNIntersector1<4,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  bVar23 = (byte)local_1310.valid;
                } while( true );
              }
            }
            local_1298 = local_1298 + 1;
          } while (local_1298 != local_12c8);
        }
        fVar96 = (ray->super_RayK<1>).tfar;
        auVar77 = ZEXT1664(CONCAT412(fVar96,CONCAT48(fVar96,CONCAT44(fVar96,fVar96))));
        auVar92 = ZEXT1664(local_11b0);
        auVar94 = ZEXT1664(local_11c0);
        auVar95 = ZEXT1664(local_11d0);
        auVar100 = ZEXT1664(local_11f0);
        auVar101 = ZEXT1664(local_1200);
        auVar106 = ZEXT1664(local_1220);
        auVar107 = ZEXT1664(local_1230);
        auVar108 = ZEXT1664(local_1240);
        fVar96 = local_11e0;
        fVar97 = fStack_11dc;
        fVar98 = fStack_11d8;
        fVar99 = fStack_11d4;
        fVar102 = local_1210;
        fVar103 = fStack_120c;
        fVar104 = fStack_1208;
        fVar105 = fStack_1204;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }